

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalNinjaGenerator::WriteDyndepFile
          (cmGlobalNinjaGenerator *this,string *dir_top_src,string *dir_top_bld,string *dir_cur_src,
          string *dir_cur_bld,string *arg_dd,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_ddis,string *module_dir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *linked_target_dirs,string *arg_lang)

{
  undefined1 *this_00;
  undefined1 *this_01;
  cmake *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  key_type *pkVar3;
  key_type *pkVar4;
  pointer pcVar5;
  bool bVar6;
  bool bVar7;
  undefined8 uVar8;
  Value *pVVar9;
  mapped_type *pmVar10;
  pointer pcVar11;
  string *psVar12;
  iterator iVar13;
  cmDyndepObjectInfo *object;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  key_type *pkVar15;
  Value *__range3;
  string *p;
  key_type *__k;
  const_iterator cVar16;
  Value tm;
  undefined1 local_618 [32];
  string ltmn;
  string target_mods_file;
  vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_> objects;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mod_files;
  pointer pbStack_550;
  pointer local_548;
  pointer pbStack_540;
  string local_538;
  string local_518;
  iterator i;
  cmGeneratedFileStream tmf;
  Value local_2a0;
  cmGeneratedFileStream ddf;
  undefined4 extraout_var;
  
  pcVar1 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
       (pcVar1->CurrentSnapshot).Position.Position;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)(pcVar1->CurrentSnapshot).State;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (pcVar1->CurrentSnapshot).Position.Tree;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&ddf,(cmStateSnapshot *)&tmf);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)&ddf,dir_cur_src);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&ddf,(cmStateSnapshot *)&tmf);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&ddf,dir_cur_bld);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&ddf,(cmStateSnapshot *)&tmf);
  cmStateDirectory::SetRelativePathTopSource
            ((cmStateDirectory *)&ddf,(dir_top_src->_M_dataplus)._M_p);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&ddf,(cmStateSnapshot *)&tmf);
  cmStateDirectory::SetRelativePathTopBinary
            ((cmStateDirectory *)&ddf,(dir_top_bld->_M_dataplus)._M_p);
  mod_files._M_t._M_impl._0_8_ = this;
  std::make_unique<cmMakefile,cmGlobalNinjaGenerator*,cmStateSnapshot&>
            ((cmGlobalNinjaGenerator **)&ddf,(cmStateSnapshot *)&mod_files);
  uVar8._0_4_ = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[2])
                          (this,ddf.super_ofstream.
                                super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream);
  mod_files._M_t._M_impl._0_8_ =
       ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
  uVar8._4_4_ = extraout_var;
  ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)0x0;
  std::vector<cmMakefile*,std::allocator<cmMakefile*>>::emplace_back<cmMakefile*>
            ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)
             &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles,
             (cmMakefile **)&mod_files);
  mod_files._M_t._M_impl._0_8_ = uVar8;
  std::vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>>::emplace_back<cmLocalGenerator*>
            ((vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>> *)
             &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators,
             (cmLocalGenerator **)&mod_files);
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
            ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)&ddf);
  objects.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  objects.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar14 = (arg_ddis->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (arg_ddis->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar14 == pbVar2) {
      mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &mod_files._M_t._M_impl.super__Rb_tree_header._M_header;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           mod_files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pbVar14 = (linked_target_dirs->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (linked_target_dirs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      goto LAB_00256103;
    }
    Json::Value::Value(&tm,nullValue);
    std::ifstream::ifstream(&ddf,(pbVar14->_M_dataplus)._M_p,_S_in|_S_bin);
    Json::Reader::Reader((Reader *)&tmf);
    bVar6 = Json::Reader::parse((Reader *)&tmf,(istream *)&ddf,&tm,false);
    if (bVar6) {
      mod_files._M_t._M_impl._0_8_ =
           &mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           ((ulong)mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
           0xffffffffffffff00);
      local_548 = (pointer)0x0;
      pbStack_540 = (pointer)0x0;
      pbStack_550 = (pointer)0x0;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pVVar9 = Json::Value::operator[](&tm,"object");
      Json::Value::asString_abi_cxx11_(&target_mods_file,pVVar9);
      std::__cxx11::string::operator=((string *)&mod_files,(string *)&target_mods_file);
      std::__cxx11::string::~string((string *)&target_mods_file);
      pVVar9 = Json::Value::operator[](&tm,"provides");
      bVar7 = Json::Value::isArray(pVVar9);
      if (bVar7) {
        cVar16 = Json::Value::begin(pVVar9);
        ltmn._M_dataplus._M_p = (pointer)cVar16.super_ValueIteratorBase.current_._M_node;
        ltmn._M_string_length._0_1_ = cVar16.super_ValueIteratorBase.isNull_;
        cVar16 = Json::Value::end(pVVar9);
        local_618._0_8_ = cVar16.super_ValueIteratorBase.current_._M_node;
        local_618[8] = cVar16.super_ValueIteratorBase.isNull_;
        while( true ) {
          bVar7 = Json::ValueIteratorBase::operator!=
                            ((ValueIteratorBase *)&ltmn,(SelfType *)local_618);
          if (!bVar7) break;
          pVVar9 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&ltmn);
          Json::Value::asString_abi_cxx11_(&target_mods_file,pVVar9);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                     &target_mods_file);
          std::__cxx11::string::~string((string *)&target_mods_file);
          Json::ValueIteratorBase::increment((ValueIteratorBase *)&ltmn);
        }
      }
      pVVar9 = Json::Value::operator[](&tm,"requires");
      bVar7 = Json::Value::isArray(pVVar9);
      if (bVar7) {
        cVar16 = Json::Value::begin(pVVar9);
        ltmn._M_dataplus._M_p = (pointer)cVar16.super_ValueIteratorBase.current_._M_node;
        ltmn._M_string_length._0_1_ = cVar16.super_ValueIteratorBase.isNull_;
        cVar16 = Json::Value::end(pVVar9);
        local_618._0_8_ = cVar16.super_ValueIteratorBase.current_._M_node;
        local_618[8] = cVar16.super_ValueIteratorBase.isNull_;
        while( true ) {
          bVar7 = Json::ValueIteratorBase::operator!=
                            ((ValueIteratorBase *)&ltmn,(SelfType *)local_618);
          if (!bVar7) break;
          pVVar9 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&ltmn);
          Json::Value::asString_abi_cxx11_(&target_mods_file,pVVar9);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &pbStack_550,&target_mods_file);
          std::__cxx11::string::~string((string *)&target_mods_file);
          Json::ValueIteratorBase::increment((ValueIteratorBase *)&ltmn);
        }
      }
      std::vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>::
      emplace_back<cmDyndepObjectInfo>(&objects,(cmDyndepObjectInfo *)&mod_files);
      cmDyndepObjectInfo::~cmDyndepObjectInfo((cmDyndepObjectInfo *)&mod_files);
    }
    else {
      std::operator+(&target_mods_file,"-E cmake_ninja_dyndep failed to parse ",pbVar14);
      Json::Reader::getFormattedErrorMessages_abi_cxx11_(&ltmn,(Reader *)&tmf);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mod_files
                     ,&target_mods_file,&ltmn);
      cmSystemTools::Error
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mod_files);
      std::__cxx11::string::~string((string *)&mod_files);
      std::__cxx11::string::~string((string *)&ltmn);
      std::__cxx11::string::~string((string *)&target_mods_file);
    }
    Json::Reader::~Reader((Reader *)&tmf);
    std::ifstream::~ifstream(&ddf);
    Json::Value::~Value(&tm);
    pbVar14 = pbVar14 + 1;
  } while (bVar6);
  bVar6 = false;
  goto LAB_002566d0;
LAB_00256103:
  bVar6 = pbVar14 == pbVar2;
  if (bVar6) goto LAB_002562b8;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmf,pbVar14,
                 "/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ddf,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmf,arg_lang)
  ;
  std::operator+(&ltmn,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ddf,
                 "Modules.json");
  std::__cxx11::string::~string((string *)&ddf);
  std::__cxx11::string::~string((string *)&tmf);
  Json::Value::Value(&tm,nullValue);
  std::ifstream::ifstream
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ddf,
             ltmn._M_dataplus._M_p,_S_in|_S_bin);
  Json::Reader::Reader((Reader *)&tmf);
  if (((&ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    bVar7 = Json::Reader::parse((Reader *)&tmf,(istream *)&ddf,&tm,false);
    if (!bVar7) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_618,
                     "-E cmake_ninja_dyndep failed to parse ",pbVar14);
      Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_538,(Reader *)&tmf);
      std::operator+(&target_mods_file,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_618,
                     &local_538);
      cmSystemTools::Error(&target_mods_file);
      std::__cxx11::string::~string((string *)&target_mods_file);
      std::__cxx11::string::~string((string *)&local_538);
      std::__cxx11::string::~string((string *)local_618);
      Json::Reader::~Reader((Reader *)&tmf);
      std::ifstream::~ifstream(&ddf);
      Json::Value::~Value(&tm);
      std::__cxx11::string::~string((string *)&ltmn);
      goto LAB_002566bf;
    }
  }
  bVar6 = Json::Value::isObject(&tm);
  if (bVar6) {
    Json::Value::begin((Value *)&i);
    while( true ) {
      Json::Value::end((Value *)&target_mods_file);
      bVar6 = Json::ValueIteratorBase::operator!=
                        ((ValueIteratorBase *)&i,(SelfType *)&target_mods_file);
      if (!bVar6) break;
      pVVar9 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&i);
      Json::Value::asString_abi_cxx11_((string *)local_618,pVVar9);
      Json::ValueIteratorBase::key((Value *)&target_mods_file,(ValueIteratorBase *)&i);
      Json::Value::asString_abi_cxx11_(&local_538,(Value *)&target_mods_file);
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&mod_files,&local_538);
      std::__cxx11::string::operator=((string *)pmVar10,(string *)local_618);
      std::__cxx11::string::~string((string *)&local_538);
      Json::Value::~Value((Value *)&target_mods_file);
      std::__cxx11::string::~string((string *)local_618);
      Json::ValueIteratorBase::increment((ValueIteratorBase *)&i);
    }
  }
  Json::Reader::~Reader((Reader *)&tmf);
  std::ifstream::~ifstream(&ddf);
  Json::Value::~Value(&tm);
  std::__cxx11::string::~string((string *)&ltmn);
  pbVar14 = pbVar14 + 1;
  goto LAB_00256103;
LAB_002562b8:
  Json::Value::Value(&tm,objectValue);
  pcVar5 = objects.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pcVar11 = objects.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start; pcVar11 != pcVar5; pcVar11 = pcVar11 + 1
      ) {
    pkVar3 = (pcVar11->Provides).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pkVar15 = (pcVar11->Provides).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pkVar15 != pkVar3;
        pkVar15 = pkVar15 + 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ddf,
                     module_dir,pkVar15);
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&mod_files,pkVar15);
      std::__cxx11::string::_M_assign((string *)pmVar10);
      Json::Value::Value(&local_2a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ddf);
      pVVar9 = Json::Value::operator[](&tm,pkVar15);
      Json::Value::operator=(pVVar9,&local_2a0);
      Json::Value::~Value(&local_2a0);
      std::__cxx11::string::~string((string *)&ddf);
    }
  }
  cmGeneratedFileStream::cmGeneratedFileStream(&ddf,arg_dd,false,None);
  std::operator<<((ostream *)&ddf,"ninja_dyndep_version = 1.0\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"dyndep",(allocator<char> *)&target_mods_file);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)&tmf,&local_518);
  std::__cxx11::string::~string((string *)&local_518);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x40,
             (char (*) [1])0x49714e);
  pcVar5 = objects.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  this_00 = &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x58;
  this_01 = &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x88;
  for (pcVar11 = objects.super__Vector_base<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start; pcVar11 != pcVar5; pcVar11 = pcVar11 + 1
      ) {
    std::__cxx11::string::_M_assign
              ((string *)
               tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._64_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00);
    pkVar3 = (pcVar11->Provides).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pkVar15 = (pcVar11->Provides).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pkVar15 != pkVar3;
        pkVar15 = pkVar15 + 1) {
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&mod_files._M_t,pkVar15);
      psVar12 = ConvertToNinjaPath(this,pmVar10);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00,psVar12);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
    pkVar4 = (pcVar11->Requires).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__k = (pcVar11->Requires).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __k != pkVar4; __k = __k + 1) {
      iVar13 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(&mod_files._M_t,__k);
      if ((_Rb_tree_header *)iVar13._M_node != &mod_files._M_t._M_impl.super__Rb_tree_header) {
        psVar12 = ConvertToNinjaPath(this,(string *)(iVar13._M_node + 2));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_01,psVar12);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0xb8);
    if ((pcVar11->Provides).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pcVar11->Provides).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<char_const(&)[7],char_const(&)[2]>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                     field_0xb8,(char (*) [7])"restat",(char (*) [2])0x4a81a8);
    }
    WriteBuild(this,(ostream *)&ddf,(cmNinjaBuild *)&tmf,0,(bool *)0x0);
  }
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&tmf);
  cmsys::SystemTools::GetFilenamePath((string *)local_618,arg_dd);
  std::operator+(&ltmn,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_618,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmf,&ltmn,
                 arg_lang);
  std::operator+(&target_mods_file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmf,
                 "Modules.json");
  std::__cxx11::string::~string((string *)&tmf);
  std::__cxx11::string::~string((string *)&ltmn);
  std::__cxx11::string::~string((string *)local_618);
  cmGeneratedFileStream::cmGeneratedFileStream(&tmf,&target_mods_file,false,None);
  Json::operator<<((ostream *)&tmf,&tm);
  cmGeneratedFileStream::~cmGeneratedFileStream(&tmf);
  std::__cxx11::string::~string((string *)&target_mods_file);
  cmGeneratedFileStream::~cmGeneratedFileStream(&ddf);
  Json::Value::~Value(&tm);
LAB_002566bf:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&mod_files._M_t);
LAB_002566d0:
  std::vector<cmDyndepObjectInfo,_std::allocator<cmDyndepObjectInfo>_>::~vector(&objects);
  return bVar6;
}

Assistant:

bool cmGlobalNinjaGenerator::WriteDyndepFile(
  std::string const& dir_top_src, std::string const& dir_top_bld,
  std::string const& dir_cur_src, std::string const& dir_cur_bld,
  std::string const& arg_dd, std::vector<std::string> const& arg_ddis,
  std::string const& module_dir,
  std::vector<std::string> const& linked_target_dirs,
  std::string const& arg_lang)
{
  // Setup path conversions.
  {
    cmStateSnapshot snapshot = this->GetCMakeInstance()->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentSource(dir_cur_src);
    snapshot.GetDirectory().SetCurrentBinary(dir_cur_bld);
    snapshot.GetDirectory().SetRelativePathTopSource(dir_top_src.c_str());
    snapshot.GetDirectory().SetRelativePathTopBinary(dir_top_bld.c_str());
    auto mfd = cm::make_unique<cmMakefile>(this, snapshot);
    std::unique_ptr<cmLocalNinjaGenerator> lgd(
      static_cast<cmLocalNinjaGenerator*>(
        this->CreateLocalGenerator(mfd.get())));
    this->Makefiles.push_back(mfd.release());
    this->LocalGenerators.push_back(lgd.release());
  }

  std::vector<cmDyndepObjectInfo> objects;
  for (std::string const& arg_ddi : arg_ddis) {
    // Load the ddi file and compute the module file paths it provides.
    Json::Value ddio;
    Json::Value const& ddi = ddio;
    cmsys::ifstream ddif(arg_ddi.c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (!reader.parse(ddif, ddio, false)) {
      cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse " + arg_ddi +
                           reader.getFormattedErrorMessages());
      return false;
    }

    cmDyndepObjectInfo info;
    info.Object = ddi["object"].asString();
    Json::Value const& ddi_provides = ddi["provides"];
    if (ddi_provides.isArray()) {
      for (auto const& ddi_provide : ddi_provides) {
        info.Provides.push_back(ddi_provide.asString());
      }
    }
    Json::Value const& ddi_requires = ddi["requires"];
    if (ddi_requires.isArray()) {
      for (auto const& ddi_require : ddi_requires) {
        info.Requires.push_back(ddi_require.asString());
      }
    }
    objects.push_back(std::move(info));
  }

  // Map from module name to module file path, if known.
  std::map<std::string, std::string> mod_files;

  // Populate the module map with those provided by linked targets first.
  for (std::string const& linked_target_dir : linked_target_dirs) {
    std::string const ltmn =
      linked_target_dir + "/" + arg_lang + "Modules.json";
    Json::Value ltm;
    cmsys::ifstream ltmf(ltmn.c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (ltmf && !reader.parse(ltmf, ltm, false)) {
      cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse " +
                           linked_target_dir +
                           reader.getFormattedErrorMessages());
      return false;
    }
    if (ltm.isObject()) {
      for (Json::Value::iterator i = ltm.begin(); i != ltm.end(); ++i) {
        mod_files[i.key().asString()] = i->asString();
      }
    }
  }

  // Extend the module map with those provided by this target.
  // We do this after loading the modules provided by linked targets
  // in case we have one of the same name that must be preferred.
  Json::Value tm = Json::objectValue;
  for (cmDyndepObjectInfo const& object : objects) {
    for (std::string const& p : object.Provides) {
      std::string const mod = module_dir + p;
      mod_files[p] = mod;
      tm[p] = mod;
    }
  }

  cmGeneratedFileStream ddf(arg_dd);
  ddf << "ninja_dyndep_version = 1.0\n";

  {
    cmNinjaBuild build("dyndep");
    build.Outputs.emplace_back("");
    for (cmDyndepObjectInfo const& object : objects) {
      build.Outputs[0] = object.Object;
      build.ImplicitOuts.clear();
      for (std::string const& p : object.Provides) {
        build.ImplicitOuts.push_back(this->ConvertToNinjaPath(mod_files[p]));
      }
      build.ImplicitDeps.clear();
      for (std::string const& r : object.Requires) {
        auto mit = mod_files.find(r);
        if (mit != mod_files.end()) {
          build.ImplicitDeps.push_back(this->ConvertToNinjaPath(mit->second));
        }
      }
      build.Variables.clear();
      if (!object.Provides.empty()) {
        build.Variables.emplace("restat", "1");
      }

      this->WriteBuild(ddf, build);
    }
  }

  // Store the map of modules provided by this target in a file for
  // use by dependents that reference this target in linked-target-dirs.
  std::string const target_mods_file =
    cmSystemTools::GetFilenamePath(arg_dd) + "/" + arg_lang + "Modules.json";
  cmGeneratedFileStream tmf(target_mods_file);
  tmf << tm;

  return true;
}